

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_TransferPointer
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  int selector;
  int toSlot;
  int flags;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  char *pcVar9;
  bool bVar10;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar7 = (AActor *)(param->field_0).field_1.a;
      if (pAVar7 != (AActor *)0x0) {
        if ((pAVar7->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          (pAVar7->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar7->super_DThinker).super_DObject.Class;
        bVar10 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar10) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar10 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c6df5;
        }
      }
      if (numparam == 1) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
              if (numparam == 3) {
                pcVar9 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  pVVar1 = param + 1;
                  iVar3 = param[2].field_0.i;
                  selector = param[3].field_0.i;
                  if (numparam < 5) {
                    pVVar5 = defaultparam->Array;
                    if (pVVar5[4].field_0.field_3.Type != '\0') {
                      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003c6e14;
                    }
                  }
                  else {
                    pVVar5 = param;
                    if (param[4].field_0.field_3.Type != '\0') {
                      pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003c6e14:
                      __assert_fail(pcVar9,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x363,
                                    "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  toSlot = pVVar5[4].field_0.i;
                  if (numparam < 6) {
                    param = defaultparam->Array;
                    if (param[5].field_0.field_3.Type == '\0') goto LAB_003c6d07;
                    pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') {
LAB_003c6d07:
                      flags = param[5].field_0.i;
                      pAVar6 = COPY_AAPTR(pAVar7,(pVVar1->field_0).i);
                      pAVar7 = COPY_AAPTR(pAVar7,iVar3);
                      if (pAVar7 != (AActor *)0x0) {
                        pAVar8 = COPY_AAPTR(pAVar6,selector);
                        pAVar6 = (AActor *)0x0;
                        if (pAVar8 != pAVar7) {
                          pAVar6 = pAVar8;
                        }
                        if (toSlot == 0) {
                          toSlot = selector;
                        }
                        ASSIGN_AAPTR(pAVar7,toSlot,pAVar6,flags);
                      }
                      return 0;
                    }
                    pcVar9 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar9,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x364,
                                "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar9 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x362,
                            "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar9 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x361,
                        "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x360,
                    "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c6df5:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x35f,
                "int AF_AActor_A_TransferPointer(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TransferPointer)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(ptr_source);
	PARAM_INT		(ptr_recipient);
	PARAM_INT		(ptr_sourcefield);
	PARAM_INT_DEF	(ptr_recipientfield);
	PARAM_INT_DEF	(flags);

	AActor *source, *recipient;

	// Exchange pointers with actors to whom you have pointers (or with yourself, if you must)
	source = COPY_AAPTR(self, ptr_source);
	recipient = COPY_AAPTR(self, ptr_recipient);	// pick an actor to store the provided pointer value
	if (recipient == NULL)
	{
		return 0;
	}

	// convert source from dataprovider to data
	source = COPY_AAPTR(source, ptr_sourcefield);
	if (source == recipient)
	{ // The recepient should not acquire a pointer to itself; will write NULL}
		source = NULL;
	}
	if (ptr_recipientfield == AAPTR_DEFAULT)
	{ // If default: Write to same field as data was read from
		ptr_recipientfield = ptr_sourcefield;
	}
	ASSIGN_AAPTR(recipient, ptr_recipientfield, source, flags);
	return 0;
}